

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.hxx
# Opt level: O0

void __thiscall
SpikingNeuron::SpikingNeuron(SpikingNeuron *this,Time *time,string *name,string *type)

{
  string local_68;
  string local_48;
  string *local_28;
  string *type_local;
  string *name_local;
  Time *time_local;
  SpikingNeuron *this_local;
  
  local_28 = type;
  type_local = name;
  name_local = (string *)time;
  time_local = (Time *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  std::__cxx11::string::string((string *)&local_68,(string *)type);
  Neuron::Neuron(&this->super_Neuron,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,(Time *)name_local,name,type);
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR___cxa_pure_virtual_0018f2c0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__SpikingNeuron_0018f2f0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__SpikingNeuron_0018f388;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__SpikingNeuron_0018f3d0;
  return;
}

Assistant:

SpikingNeuron (
		Time *time,   ///< global time object
		string name,   ///< object name
		string type="Spiking Neuron"   ///< object type
	) : Neuron(name, type), StochasticEventGenerator(time, name, type) {}